

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_rotate.cpp
# Opt level: O2

size_t embree::sse2::BVHNRotate<4>::rotate(NodeRef parentRef,size_t depth)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  size_t sVar13;
  long lVar14;
  ssize_t i;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  long in_R8;
  ulong uVar20;
  long in_R9;
  ulong uVar21;
  long in_R10;
  ulong uVar22;
  size_t c;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint uVar34;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float local_17c;
  vint4 cdepth;
  int pos [4];
  vfloat4 area0123;
  vfloat4 childArea;
  ulong uVar19;
  undefined1 auVar31 [16];
  
  if ((parentRef.ptr & 0x8000000000000008) == 0) {
    for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
      sVar13 = rotate((NodeRef)*(size_t *)(parentRef.ptr + lVar23 * 8),depth + 1);
      pos[lVar23 + -4] = (int)sVar13;
    }
    fVar58 = *(float *)(parentRef.ptr + 0x50) - *(float *)(parentRef.ptr + 0x40);
    fVar66 = *(float *)(parentRef.ptr + 0x54) - *(float *)(parentRef.ptr + 0x44);
    fVar67 = *(float *)(parentRef.ptr + 0x58) - *(float *)(parentRef.ptr + 0x48);
    fVar68 = *(float *)(parentRef.ptr + 0x5c) - *(float *)(parentRef.ptr + 0x4c);
    fVar69 = *(float *)(parentRef.ptr + 0x70) - *(float *)(parentRef.ptr + 0x60);
    fVar77 = *(float *)(parentRef.ptr + 0x74) - *(float *)(parentRef.ptr + 100);
    fVar78 = *(float *)(parentRef.ptr + 0x78) - *(float *)(parentRef.ptr + 0x68);
    fVar79 = *(float *)(parentRef.ptr + 0x7c) - *(float *)(parentRef.ptr + 0x6c);
    childArea.field_0.v[0] =
         fVar69 * fVar58 +
         (fVar58 + fVar69) * (*(float *)(parentRef.ptr + 0x30) - *(float *)(parentRef.ptr + 0x20));
    childArea.field_0.v[1] =
         fVar77 * fVar66 +
         (fVar66 + fVar77) * (*(float *)(parentRef.ptr + 0x34) - *(float *)(parentRef.ptr + 0x24));
    childArea.field_0.v[2] =
         fVar78 * fVar67 +
         (fVar67 + fVar78) * (*(float *)(parentRef.ptr + 0x38) - *(float *)(parentRef.ptr + 0x28));
    childArea.field_0.v[3] =
         fVar79 * fVar68 +
         (fVar68 + fVar79) * (*(float *)(parentRef.ptr + 0x3c) - *(float *)(parentRef.ptr + 0x2c));
    auVar61._4_4_ = *(float *)(parentRef.ptr + 0x44);
    auVar61._0_4_ = *(float *)(parentRef.ptr + 0x24);
    auVar61._8_4_ = *(float *)(parentRef.ptr + 100);
    auVar61._12_4_ = 0;
    auVar72._4_4_ = *(float *)(parentRef.ptr + 0x48);
    auVar72._0_4_ = *(float *)(parentRef.ptr + 0x28);
    auVar72._8_4_ = *(float *)(parentRef.ptr + 0x68);
    auVar72._12_4_ = 0;
    auVar41._4_4_ = *(float *)(parentRef.ptr + 0x50);
    auVar41._0_4_ = *(float *)(parentRef.ptr + 0x30);
    auVar41._8_4_ = *(float *)(parentRef.ptr + 0x70);
    auVar41._12_4_ = 0;
    auVar91._4_4_ = *(float *)(parentRef.ptr + 0x54);
    auVar91._0_4_ = *(float *)(parentRef.ptr + 0x34);
    auVar91._8_4_ = *(float *)(parentRef.ptr + 0x74);
    auVar91._12_4_ = 0;
    auVar83._4_4_ = *(float *)(parentRef.ptr + 0x58);
    auVar83._0_4_ = *(float *)(parentRef.ptr + 0x38);
    auVar83._8_4_ = *(float *)(parentRef.ptr + 0x78);
    auVar83._12_4_ = 0;
    auVar84._4_4_ = *(float *)(parentRef.ptr + 0x5c);
    auVar84._0_4_ = *(float *)(parentRef.ptr + 0x3c);
    auVar84._8_4_ = *(float *)(parentRef.ptr + 0x7c);
    auVar84._12_4_ = 0;
    iVar24 = (int)depth + 1;
    local_17c = 0.0;
    lVar23 = -1;
    auVar63._0_4_ = -(uint)(0x20 < iVar24 + cdepth.field_0.i[0]);
    auVar63._4_4_ = -(uint)(0x20 < iVar24 + cdepth.field_0.i[1]);
    auVar63._8_4_ = -(uint)(0x20 < iVar24 + cdepth.field_0.i[2]);
    auVar63._12_4_ = -(uint)(0x20 < iVar24 + cdepth.field_0.i[3]);
    lVar16 = lVar23;
    lVar15 = lVar23;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      uVar19 = *(ulong *)(parentRef.ptr + lVar17 * 8);
      if ((uVar19 & 0x8000000000000008) == 0) {
        uVar18 = *(undefined4 *)(uVar19 + 0x68);
        uVar10 = *(undefined4 *)(uVar19 + 0x30);
        uVar11 = *(undefined4 *)(uVar19 + 0x50);
        auVar94._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x40),*(undefined4 *)(uVar19 + 0x20));
        auVar94._8_4_ = *(undefined4 *)(uVar19 + 0x60);
        auVar94._12_4_ = 0;
        auVar80._4_4_ = *(undefined4 *)(uVar19 + 0x44);
        auVar80._0_4_ = *(undefined4 *)(uVar19 + 0x24);
        auVar80._8_4_ = *(undefined4 *)(uVar19 + 100);
        auVar80._12_4_ = 0;
        auVar85._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x48),*(undefined4 *)(uVar19 + 0x28));
        auVar85._8_4_ = uVar18;
        auVar85._12_4_ = 0;
        auVar92._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x4c),*(undefined4 *)(uVar19 + 0x2c));
        auVar92._8_4_ = *(undefined4 *)(uVar19 + 0x6c);
        auVar92._12_4_ = 0;
        uVar12 = *(undefined4 *)(uVar19 + 0x70);
        auVar106._0_8_ = CONCAT44(uVar11,uVar10);
        auVar106._8_4_ = uVar12;
        auVar106._12_4_ = 0;
        auVar59._4_4_ = *(undefined4 *)(uVar19 + 0x54);
        auVar59._0_4_ = *(undefined4 *)(uVar19 + 0x34);
        auVar59._8_4_ = *(undefined4 *)(uVar19 + 0x74);
        auVar59._12_4_ = 0;
        auVar103._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x58),*(undefined4 *)(uVar19 + 0x38));
        auVar103._8_4_ = *(undefined4 *)(uVar19 + 0x78);
        auVar103._12_4_ = 0;
        auVar42._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x5c),*(undefined4 *)(uVar19 + 0x3c));
        auVar42._8_4_ = *(undefined4 *)(uVar19 + 0x7c);
        auVar42._12_4_ = 0;
        auVar27._4_4_ = *(float *)(parentRef.ptr + 0x40);
        auVar27._0_4_ = *(float *)(parentRef.ptr + 0x20);
        auVar27._8_4_ = *(float *)(parentRef.ptr + 0x60);
        auVar27._12_4_ = 0;
        auVar26 = minps(auVar27,auVar80);
        auVar52 = maxps(auVar41,auVar59);
        auVar104._8_4_ = uVar18;
        auVar104._0_8_ = auVar85._0_8_;
        auVar104._12_4_ = 0;
        auVar105 = minps(auVar104,auVar92);
        auVar86._8_4_ = *(undefined4 *)(uVar19 + 0x78);
        auVar86._0_8_ = auVar103._0_8_;
        auVar86._12_4_ = 0;
        auVar87 = maxps(auVar86,auVar42);
        auVar97._8_4_ = *(undefined4 *)(uVar19 + 0x7c);
        auVar97._0_8_ = auVar42._0_8_;
        auVar97._12_4_ = 0;
        auVar26 = minps(auVar26,auVar105);
        auVar52 = maxps(auVar52,auVar87);
        fVar58 = auVar52._0_4_ - auVar26._0_4_;
        fVar66 = auVar52._4_4_ - auVar26._4_4_;
        fVar67 = auVar52._8_4_ - auVar26._8_4_;
        auVar52._8_4_ = *(undefined4 *)(uVar19 + 0x60);
        auVar52._0_8_ = auVar94._0_8_;
        auVar52._12_4_ = 0;
        auVar26 = minps(auVar52,auVar27);
        auVar88._8_4_ = uVar12;
        auVar88._0_8_ = auVar106._0_8_;
        auVar88._12_4_ = 0;
        auVar52 = maxps(auVar88,auVar41);
        auVar26 = minps(auVar26,auVar105);
        auVar52 = maxps(auVar52,auVar87);
        fVar68 = auVar52._0_4_ - auVar26._0_4_;
        fVar69 = auVar52._4_4_ - auVar26._4_4_;
        fVar77 = auVar52._8_4_ - auVar26._8_4_;
        auVar95 = minps(auVar94,auVar80);
        auVar101._4_4_ = uVar11;
        auVar101._0_4_ = uVar10;
        auVar101._8_4_ = uVar12;
        auVar101._12_4_ = 0;
        auVar70 = maxps(auVar101,auVar59);
        auVar26 = minps(auVar27,auVar92);
        auVar81._8_4_ = *(undefined4 *)(uVar19 + 0x6c);
        auVar81._0_8_ = auVar92._0_8_;
        auVar81._12_4_ = 0;
        auVar52 = minps(auVar95,auVar26);
        auVar26 = maxps(auVar41,auVar97);
        auVar26 = maxps(auVar70,auVar26);
        fVar96 = auVar26._0_4_ - auVar52._0_4_;
        fVar98 = auVar26._4_4_ - auVar52._4_4_;
        fVar99 = auVar26._8_4_ - auVar52._8_4_;
        auVar48._8_4_ = uVar18;
        auVar48._0_8_ = auVar85._0_8_;
        auVar48._12_4_ = 0;
        auVar27 = minps(auVar48,auVar27);
        auVar26 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar103,auVar41);
        auVar27 = maxps(auVar70,auVar27);
        fVar78 = auVar27._0_4_ - auVar26._0_4_;
        fVar79 = auVar27._4_4_ - auVar26._4_4_;
        fVar93 = auVar27._8_4_ - auVar26._8_4_;
        auVar43._0_4_ = fVar58 * fVar67 + fVar67 * fVar66 + fVar66 * fVar58;
        auVar43._4_4_ = fVar68 * fVar77 + fVar77 * fVar69 + fVar69 * fVar68;
        auVar43._8_4_ = fVar96 * fVar99 + fVar99 * fVar98 + fVar98 * fVar96;
        auVar43._12_4_ = fVar78 * fVar93 + fVar93 * fVar79 + fVar79 * fVar78;
        auVar90._4_4_ = auVar43._0_4_;
        auVar90._0_4_ = auVar43._4_4_;
        auVar90._8_4_ = auVar43._12_4_;
        auVar90._12_4_ = auVar43._8_4_;
        auVar27 = minps(auVar90,auVar43);
        auVar100._0_8_ = auVar27._8_8_;
        auVar100._8_4_ = auVar27._0_4_;
        auVar100._12_4_ = auVar27._4_4_;
        auVar101 = minps(auVar100,auVar27);
        auVar44._4_4_ = -(uint)(auVar43._4_4_ == auVar101._4_4_);
        auVar44._0_4_ = -(uint)(auVar43._0_4_ == auVar101._0_4_);
        auVar44._8_4_ = -(uint)(auVar43._8_4_ == auVar101._8_4_);
        auVar44._12_4_ = -(uint)(auVar43._12_4_ == auVar101._12_4_);
        uVar18 = movmskps((int)uVar19,auVar44);
        uVar19 = CONCAT44((int)(uVar19 >> 0x20),uVar18);
        auVar27 = minps(auVar61,auVar80);
        auVar26 = maxps(auVar91,auVar59);
        auVar27 = minps(auVar27,auVar105);
        auVar26 = maxps(auVar26,auVar87);
        fVar58 = auVar26._0_4_ - auVar27._0_4_;
        fVar67 = auVar26._4_4_ - auVar27._4_4_;
        fVar69 = auVar26._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar94,auVar61);
        auVar35._4_4_ = uVar11;
        auVar35._0_4_ = uVar10;
        auVar35._8_4_ = uVar12;
        auVar35._12_4_ = 0;
        auVar26 = maxps(auVar35,auVar91);
        auVar27 = minps(auVar27,auVar105);
        auVar26 = maxps(auVar26,auVar87);
        fVar66 = auVar26._0_4_ - auVar27._0_4_;
        fVar68 = auVar26._4_4_ - auVar27._4_4_;
        fVar77 = auVar26._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar61,auVar81);
        auVar26 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar91,auVar42);
        auVar27 = maxps(auVar70,auVar27);
        fVar78 = auVar27._0_4_ - auVar26._0_4_;
        fVar93 = auVar27._4_4_ - auVar26._4_4_;
        fVar98 = auVar27._8_4_ - auVar26._8_4_;
        auVar27 = minps(auVar85,auVar61);
        auVar26 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar103,auVar91);
        auVar27 = maxps(auVar70,auVar27);
        fVar79 = auVar27._0_4_ - auVar26._0_4_;
        fVar96 = auVar27._4_4_ - auVar26._4_4_;
        fVar99 = auVar27._8_4_ - auVar26._8_4_;
        auVar45._0_4_ = fVar58 * fVar69 + fVar69 * fVar67 + fVar67 * fVar58;
        auVar45._4_4_ = fVar66 * fVar77 + fVar77 * fVar68 + fVar68 * fVar66;
        auVar45._8_4_ = fVar78 * fVar98 + fVar98 * fVar93 + fVar93 * fVar78;
        auVar45._12_4_ = fVar79 * fVar99 + fVar99 * fVar96 + fVar96 * fVar79;
        auVar28._4_4_ = auVar45._0_4_;
        auVar28._0_4_ = auVar45._4_4_;
        auVar28._8_4_ = auVar45._12_4_;
        auVar28._12_4_ = auVar45._8_4_;
        auVar27 = minps(auVar28,auVar45);
        auVar89._0_8_ = auVar27._8_8_;
        auVar89._8_4_ = auVar27._0_4_;
        auVar89._12_4_ = auVar27._4_4_;
        auVar90 = minps(auVar89,auVar27);
        auVar46._4_4_ = -(uint)(auVar45._4_4_ == auVar90._4_4_);
        auVar46._0_4_ = -(uint)(auVar45._0_4_ == auVar90._0_4_);
        auVar46._8_4_ = -(uint)(auVar45._8_4_ == auVar90._8_4_);
        auVar46._12_4_ = -(uint)(auVar45._12_4_ == auVar90._12_4_);
        uVar18 = movmskps((int)in_R8,auVar46);
        uVar20 = CONCAT44((int)((ulong)in_R8 >> 0x20),uVar18);
        auVar27 = minps(auVar72,auVar80);
        auVar26 = maxps(auVar83,auVar59);
        auVar27 = minps(auVar27,auVar105);
        auVar26 = maxps(auVar26,auVar87);
        fVar58 = auVar26._0_4_ - auVar27._0_4_;
        fVar67 = auVar26._4_4_ - auVar27._4_4_;
        fVar69 = auVar26._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar94,auVar72);
        auVar36._4_4_ = uVar11;
        auVar36._0_4_ = uVar10;
        auVar36._8_4_ = uVar12;
        auVar36._12_4_ = 0;
        auVar26 = maxps(auVar36,auVar83);
        auVar27 = minps(auVar27,auVar105);
        auVar26 = maxps(auVar26,auVar87);
        fVar66 = auVar26._0_4_ - auVar27._0_4_;
        fVar68 = auVar26._4_4_ - auVar27._4_4_;
        fVar77 = auVar26._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar72,auVar81);
        auVar26 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar83,auVar42);
        auVar27 = maxps(auVar70,auVar27);
        fVar78 = auVar27._0_4_ - auVar26._0_4_;
        fVar79 = auVar27._4_4_ - auVar26._4_4_;
        fVar93 = auVar27._8_4_ - auVar26._8_4_;
        auVar27 = minps(auVar85,auVar72);
        auVar26 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar103,auVar83);
        auVar27 = maxps(auVar70,auVar27);
        fVar96 = auVar27._0_4_ - auVar26._0_4_;
        fVar98 = auVar27._4_4_ - auVar26._4_4_;
        fVar99 = auVar27._8_4_ - auVar26._8_4_;
        auVar53._0_4_ = fVar58 * fVar69 + fVar69 * fVar67 + fVar67 * fVar58;
        auVar53._4_4_ = fVar66 * fVar77 + fVar77 * fVar68 + fVar68 * fVar66;
        auVar53._8_4_ = fVar78 * fVar93 + fVar93 * fVar79 + fVar79 * fVar78;
        auVar53._12_4_ = fVar96 * fVar99 + fVar99 * fVar98 + fVar98 * fVar96;
        auVar29._4_4_ = auVar53._0_4_;
        auVar29._0_4_ = auVar53._4_4_;
        auVar29._8_4_ = auVar53._12_4_;
        auVar29._12_4_ = auVar53._8_4_;
        auVar27 = minps(auVar29,auVar53);
        auVar47._0_8_ = auVar27._8_8_;
        auVar47._8_4_ = auVar27._0_4_;
        auVar47._12_4_ = auVar27._4_4_;
        auVar48 = minps(auVar47,auVar27);
        auVar54._4_4_ = -(uint)(auVar53._4_4_ == auVar48._4_4_);
        auVar54._0_4_ = -(uint)(auVar53._0_4_ == auVar48._0_4_);
        auVar54._8_4_ = -(uint)(auVar53._8_4_ == auVar48._8_4_);
        auVar54._12_4_ = -(uint)(auVar53._12_4_ == auVar48._12_4_);
        uVar18 = movmskps((int)in_R9,auVar54);
        uVar21 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar18);
        auVar26._4_4_ = *(float *)(parentRef.ptr + 0x4c);
        auVar26._0_4_ = *(float *)(parentRef.ptr + 0x2c);
        auVar26._8_4_ = *(float *)(parentRef.ptr + 0x6c);
        auVar26._12_4_ = 0;
        auVar27 = minps(auVar26,auVar80);
        auVar52 = maxps(auVar84,auVar59);
        auVar27 = minps(auVar27,auVar105);
        auVar52 = maxps(auVar52,auVar87);
        fVar58 = auVar52._0_4_ - auVar27._0_4_;
        fVar66 = auVar52._4_4_ - auVar27._4_4_;
        fVar67 = auVar52._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar94,auVar26);
        auVar27 = minps(auVar27,auVar105);
        auVar52 = maxps(auVar106,auVar84);
        auVar52 = maxps(auVar52,auVar87);
        fVar96 = auVar52._0_4_ - auVar27._0_4_;
        fVar98 = auVar52._4_4_ - auVar27._4_4_;
        fVar99 = auVar52._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar26,auVar81);
        auVar52 = maxps(auVar84,auVar42);
        auVar27 = minps(auVar95,auVar27);
        auVar52 = maxps(auVar70,auVar52);
        fVar78 = auVar52._0_4_ - auVar27._0_4_;
        fVar79 = auVar52._4_4_ - auVar27._4_4_;
        fVar93 = auVar52._8_4_ - auVar27._8_4_;
        auVar27 = minps(auVar85,auVar26);
        auVar26 = maxps(auVar103,auVar84);
        auVar52 = minps(auVar95,auVar27);
        auVar27 = maxps(auVar70,auVar26);
        fVar68 = auVar27._0_4_ - auVar52._0_4_;
        fVar69 = auVar27._4_4_ - auVar52._4_4_;
        fVar77 = auVar27._8_4_ - auVar52._8_4_;
        auVar95._0_4_ = fVar58 * fVar67 + fVar67 * fVar66 + fVar66 * fVar58;
        auVar95._4_4_ = fVar96 * fVar99 + fVar99 * fVar98 + fVar98 * fVar96;
        auVar95._8_4_ = fVar78 * fVar93 + fVar93 * fVar79 + fVar79 * fVar78;
        auVar95._12_4_ = fVar68 * fVar77 + fVar77 * fVar69 + fVar69 * fVar68;
        auVar70._4_4_ = auVar95._0_4_;
        auVar70._0_4_ = auVar95._4_4_;
        auVar70._8_4_ = auVar95._12_4_;
        auVar70._12_4_ = auVar95._8_4_;
        auVar27 = minps(auVar70,auVar95);
        auVar87._0_8_ = auVar27._8_8_;
        auVar87._8_4_ = auVar27._0_4_;
        auVar87._12_4_ = auVar27._4_4_;
        auVar27 = minps(auVar87,auVar27);
        auVar105._4_4_ = -(uint)(auVar95._4_4_ == auVar27._4_4_);
        auVar105._0_4_ = -(uint)(auVar95._0_4_ == auVar27._0_4_);
        auVar105._8_4_ = -(uint)(auVar95._8_4_ == auVar27._8_4_);
        auVar105._12_4_ = -(uint)(auVar95._12_4_ == auVar27._12_4_);
        uVar18 = movmskps((int)in_R10,auVar105);
        uVar22 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar18);
        lVar14 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        in_R8 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> in_R8 & 1) == 0; in_R8 = in_R8 + 1) {
          }
        }
        in_R9 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> in_R9 & 1) == 0; in_R9 = in_R9 + 1) {
          }
        }
        in_R10 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> in_R10 & 1) == 0; in_R10 = in_R10 + 1) {
          }
        }
        fVar58 = childArea.field_0.v[lVar17];
        area0123.field_0._0_4_ = auVar101._0_4_ - fVar58;
        area0123.field_0._4_4_ = auVar90._0_4_ - fVar58;
        area0123.field_0._8_4_ = auVar48._0_4_ - fVar58;
        area0123.field_0._12_4_ = auVar27._0_4_ - fVar58;
        pos[0] = (int)lVar14;
        pos[1] = (int)in_R8;
        pos[2] = (int)in_R9;
        pos[3] = (int)in_R10;
        iVar24 = (int)lVar17;
        auVar30._0_4_ = -(uint)(iVar24 == 0);
        auVar30._4_4_ = -(uint)(iVar24 == 1);
        auVar30._8_4_ = -(uint)(iVar24 == 2);
        auVar30._12_4_ = -(uint)(iVar24 == 3);
        auVar30 = auVar30 | auVar63;
        iVar24 = movmskps((int)lVar14,auVar30);
        if (iVar24 != 0xf) {
          uVar25 = auVar30._0_4_ ^ 0xffffffff;
          uVar34 = auVar30._4_4_ ^ 0xffffffff;
          auVar31._0_8_ = auVar30._0_8_ ^ 0xffffffffffffffff;
          auVar31._8_4_ = auVar30._8_4_ ^ 0xffffffff;
          auVar31._12_4_ = auVar30._12_4_ ^ 0xffffffff;
          auVar102._0_4_ = (uint)area0123.field_0._0_4_ & uVar25;
          auVar102._4_4_ = (uint)area0123.field_0._4_4_ & uVar34;
          auVar102._8_4_ = (uint)area0123.field_0._8_4_ & auVar31._8_4_;
          auVar102._12_4_ = (uint)area0123.field_0._12_4_ & auVar31._12_4_;
          auVar49._0_8_ = CONCAT44(~uVar34,~uVar25) & 0x7f8000007f800000;
          auVar49._8_4_ = ~auVar31._8_4_ & 0x7f800000;
          auVar49._12_4_ = ~auVar31._12_4_ & 0x7f800000;
          auVar49 = auVar49 | auVar102;
          auVar55._4_4_ = auVar49._0_4_;
          auVar55._0_4_ = auVar49._4_4_;
          auVar55._8_4_ = auVar49._12_4_;
          auVar55._12_4_ = auVar49._8_4_;
          auVar27 = minps(auVar55,auVar49);
          auVar37._0_8_ = auVar27._8_8_;
          auVar37._8_4_ = auVar27._0_4_;
          auVar37._12_4_ = auVar27._4_4_;
          auVar27 = minps(auVar37,auVar27);
          auVar38._0_8_ =
               CONCAT44(-(uint)(auVar27._4_4_ == auVar49._4_4_) & uVar34,
                        -(uint)(auVar27._0_4_ == auVar49._0_4_) & uVar25);
          auVar38._8_4_ = -(uint)(auVar27._8_4_ == auVar49._8_4_) & auVar31._8_4_;
          auVar38._12_4_ = -(uint)(auVar27._12_4_ == auVar49._12_4_) & auVar31._12_4_;
          iVar24 = movmskps(iVar24,auVar38);
          if (iVar24 != 0) {
            auVar31._8_4_ = auVar38._8_4_;
            auVar31._0_8_ = auVar38._0_8_;
            auVar31._12_4_ = auVar38._12_4_;
          }
          uVar18 = movmskps(iVar24,auVar31);
          uVar19 = CONCAT44((int)((ulong)lVar14 >> 0x20),uVar18);
          lVar14 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          if ((lVar17 != lVar14) && (area0123.field_0.v[lVar14] < local_17c)) {
            lVar15 = (long)pos[lVar14];
            lVar23 = lVar14;
            lVar16 = lVar17;
            local_17c = area0123.field_0.v[lVar14];
          }
        }
      }
    }
    if (lVar23 != -1) {
      lVar17 = *(long *)(parentRef.ptr + lVar16 * 8);
      uVar3 = *(undefined8 *)(parentRef.ptr + lVar23 * 8);
      *(undefined8 *)(parentRef.ptr + lVar23 * 8) = *(undefined8 *)(lVar17 + lVar15 * 8);
      *(undefined8 *)(lVar17 + lVar15 * 8) = uVar3;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x20 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x20 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x20 + lVar15 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x40 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x40 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x40 + lVar15 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x60 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x60 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x60 + lVar15 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x30 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x30 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x30 + lVar15 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x50 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x50 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x50 + lVar15 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar23 * 4);
      *(undefined4 *)(parentRef.ptr + 0x70 + lVar23 * 4) =
           *(undefined4 *)(lVar17 + 0x70 + lVar15 * 4);
      *(undefined4 *)(lVar17 + 0x70 + lVar15 * 4) = uVar18;
      auVar63 = *(undefined1 (*) [16])(lVar17 + 0x20);
      auVar83 = *(undefined1 (*) [16])(lVar17 + 0x30);
      auVar72 = *(undefined1 (*) [16])(lVar17 + 0x40);
      auVar41 = *(undefined1 (*) [16])(lVar17 + 0x50);
      auVar60._4_4_ = auVar63._0_4_;
      auVar60._0_4_ = auVar63._4_4_;
      auVar60._8_4_ = auVar63._12_4_;
      auVar60._12_4_ = auVar63._8_4_;
      auVar61 = minps(auVar60,auVar63);
      auVar4._4_8_ = auVar63._8_8_;
      auVar4._0_4_ = auVar61._4_4_;
      auVar32._0_8_ = auVar4._0_8_ << 0x20;
      auVar32._8_4_ = auVar61._8_4_;
      auVar32._12_4_ = auVar61._12_4_;
      auVar33._8_8_ = auVar61._8_8_;
      auVar33._0_8_ = auVar32._8_8_;
      if (auVar61._0_4_ <= auVar61._8_4_) {
        auVar33._0_4_ = auVar61._0_4_;
      }
      auVar62._4_4_ = auVar72._0_4_;
      auVar62._0_4_ = auVar72._4_4_;
      auVar62._8_4_ = auVar72._12_4_;
      auVar62._12_4_ = auVar72._8_4_;
      auVar63 = minps(auVar62,auVar72);
      auVar5._4_8_ = auVar72._8_8_;
      auVar5._0_4_ = auVar63._4_4_;
      auVar39._0_8_ = auVar5._0_8_ << 0x20;
      auVar39._8_4_ = auVar63._8_4_;
      auVar39._12_4_ = auVar63._12_4_;
      auVar40._8_8_ = auVar63._8_8_;
      auVar40._0_8_ = auVar39._8_8_;
      if (auVar63._0_4_ <= auVar63._8_4_) {
        auVar40._0_4_ = auVar63._0_4_;
      }
      auVar63 = *(undefined1 (*) [16])(lVar17 + 0x60);
      auVar71._4_4_ = auVar63._0_4_;
      auVar71._0_4_ = auVar63._4_4_;
      auVar71._8_4_ = auVar63._12_4_;
      auVar71._12_4_ = auVar63._8_4_;
      auVar72 = minps(auVar71,auVar63);
      auVar6._4_8_ = auVar63._8_8_;
      auVar6._0_4_ = auVar72._4_4_;
      auVar64._0_8_ = auVar6._0_8_ << 0x20;
      auVar64._8_4_ = auVar72._8_4_;
      auVar64._12_4_ = auVar72._12_4_;
      auVar65._8_8_ = auVar72._8_8_;
      auVar65._0_8_ = auVar64._8_8_;
      if (auVar72._0_4_ <= auVar72._8_4_) {
        auVar65._0_4_ = auVar72._0_4_;
      }
      auVar73._4_4_ = auVar83._0_4_;
      auVar73._0_4_ = auVar83._4_4_;
      auVar73._8_4_ = auVar83._12_4_;
      auVar73._12_4_ = auVar83._8_4_;
      auVar63 = maxps(auVar73,auVar83);
      auVar7._4_8_ = auVar83._8_8_;
      auVar7._0_4_ = auVar63._4_4_;
      auVar56._0_8_ = auVar7._0_8_ << 0x20;
      auVar56._8_4_ = auVar63._8_4_;
      auVar56._12_4_ = auVar63._12_4_;
      auVar57._8_8_ = auVar63._8_8_;
      auVar57._0_8_ = auVar56._8_8_;
      if (auVar63._8_4_ <= auVar63._0_4_) {
        auVar57._0_4_ = auVar63._0_4_;
      }
      auVar74._4_4_ = auVar41._0_4_;
      auVar74._0_4_ = auVar41._4_4_;
      auVar74._8_4_ = auVar41._12_4_;
      auVar74._12_4_ = auVar41._8_4_;
      auVar63 = maxps(auVar74,auVar41);
      auVar8._4_8_ = auVar41._8_8_;
      auVar8._0_4_ = auVar63._4_4_;
      auVar50._0_8_ = auVar8._0_8_ << 0x20;
      auVar50._8_4_ = auVar63._8_4_;
      auVar50._12_4_ = auVar63._12_4_;
      auVar51._8_8_ = auVar63._8_8_;
      auVar51._0_8_ = auVar50._8_8_;
      if (auVar63._8_4_ <= auVar63._0_4_) {
        auVar51._0_4_ = auVar63._0_4_;
      }
      auVar63 = *(undefined1 (*) [16])(lVar17 + 0x70);
      auVar82._4_4_ = auVar63._0_4_;
      auVar82._0_4_ = auVar63._4_4_;
      auVar82._8_4_ = auVar63._12_4_;
      auVar82._12_4_ = auVar63._8_4_;
      auVar83 = maxps(auVar82,auVar63);
      auVar9._4_8_ = auVar63._8_8_;
      auVar9._0_4_ = auVar83._4_4_;
      auVar75._0_8_ = auVar9._0_8_ << 0x20;
      auVar75._8_4_ = auVar83._8_4_;
      auVar75._12_4_ = auVar83._12_4_;
      auVar76._8_8_ = auVar83._8_8_;
      auVar76._0_8_ = auVar75._8_8_;
      if (auVar83._8_4_ <= auVar83._0_4_) {
        auVar76._0_4_ = auVar83._0_4_;
      }
      *(int *)(parentRef.ptr + 0x20 + lVar16 * 4) = auVar33._0_4_;
      *(int *)(parentRef.ptr + 0x40 + lVar16 * 4) = auVar40._0_4_;
      *(int *)(parentRef.ptr + 0x60 + lVar16 * 4) = auVar65._0_4_;
      *(int *)(parentRef.ptr + 0x30 + lVar16 * 4) = auVar57._0_4_;
      *(int *)(parentRef.ptr + 0x50 + lVar16 * 4) = auVar51._0_4_;
      *(int *)(parentRef.ptr + 0x70 + lVar16 * 4) = auVar76._0_4_;
      for (lVar16 = 3;
          (lVar15 = -1, -1 < lVar16 && (lVar15 = lVar16, *(long *)(parentRef.ptr + lVar16 * 8) == 8)
          ); lVar16 = lVar16 + -1) {
      }
      for (lVar16 = 0; lVar16 < lVar15; lVar16 = lVar16 + 1) {
        if (*(long *)(parentRef.ptr + lVar16 * 8) == 8) {
          *(undefined8 *)(parentRef.ptr + lVar16 * 8) = *(undefined8 *)(parentRef.ptr + lVar15 * 8);
          *(undefined8 *)(parentRef.ptr + lVar15 * 8) = 8;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x20 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x20 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x20 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x40 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x40 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x40 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x60 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x60 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x60 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x30 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x30 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x30 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x50 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x50 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x50 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar16 * 4);
          *(undefined4 *)(parentRef.ptr + 0x70 + lVar16 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x70 + lVar15 * 4);
          *(undefined4 *)(parentRef.ptr + 0x70 + lVar15 * 4) = uVar18;
          lVar14 = lVar15;
          do {
            lVar1 = lVar14 + -1;
            lVar15 = lVar16;
            if (lVar1 <= lVar16) break;
            lVar2 = lVar14 * 8;
            lVar14 = lVar1;
            lVar15 = lVar1;
          } while (*(long *)((parentRef.ptr - 8) + lVar2) == 8);
        }
      }
      for (lVar16 = 3;
          (lVar15 = -1, -1 < lVar16 && (lVar15 = lVar16, *(long *)(lVar17 + lVar16 * 8) == 8));
          lVar16 = lVar16 + -1) {
      }
      for (lVar16 = 0; lVar16 < lVar15; lVar16 = lVar16 + 1) {
        if (*(long *)(lVar17 + lVar16 * 8) == 8) {
          *(undefined8 *)(lVar17 + lVar16 * 8) = *(undefined8 *)(lVar17 + lVar15 * 8);
          *(undefined8 *)(lVar17 + lVar15 * 8) = 8;
          uVar18 = *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x20 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x20 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x40 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x40 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x60 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x60 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x30 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x30 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x50 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x50 + lVar15 * 4) = uVar18;
          uVar18 = *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4);
          *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4) = *(undefined4 *)(lVar17 + 0x70 + lVar15 * 4);
          *(undefined4 *)(lVar17 + 0x70 + lVar15 * 4) = uVar18;
          lVar14 = lVar15;
          do {
            lVar1 = lVar14 + -1;
            lVar15 = lVar16;
            if (lVar1 <= lVar16) break;
            lVar2 = lVar14 * 8;
            lVar14 = lVar1;
            lVar15 = lVar1;
          } while (*(long *)(lVar17 + -8 + lVar2) == 8);
        }
      }
      pos[lVar23 + -4] = pos[lVar23 + -4] + 1;
    }
    if (cdepth.field_0.i[1] < cdepth.field_0.i[0]) {
      cdepth.field_0.i[1] = cdepth.field_0.i[0];
    }
    if (cdepth.field_0.i[3] < cdepth.field_0.i[2]) {
      cdepth.field_0.i[3] = cdepth.field_0.i[2];
    }
    if (cdepth.field_0.i[3] < cdepth.field_0.i[1]) {
      cdepth.field_0.i[3] = cdepth.field_0.i[1];
    }
    sVar13 = (size_t)(cdepth.field_0.i[3] + 1);
  }
  else {
    sVar13 = 0;
  }
  return sVar13;
}

Assistant:

size_t BVHNRotate<4>::rotate(NodeRef parentRef, size_t depth)
    {
      /*! nothing to rotate if we reached a leaf node. */
      if (parentRef.isBarrier()) return 0;
      if (parentRef.isLeaf()) return 0;
      AABBNode* parent = parentRef.getAABBNode();
      
      /*! rotate all children first */
      vint4 cdepth;
      for (size_t c=0; c<4; c++)
	cdepth[c] = (int)rotate(parent->child(c),depth+1);
      
      /* compute current areas of all children */
      vfloat4 sizeX = parent->upper_x-parent->lower_x;
      vfloat4 sizeY = parent->upper_y-parent->lower_y;
      vfloat4 sizeZ = parent->upper_z-parent->lower_z;
      vfloat4 childArea = madd(sizeX,(sizeY + sizeZ),sizeY*sizeZ);
      
      /*! get node bounds */
      BBox<vfloat4> child1_0,child1_1,child1_2,child1_3;
      parent->bounds(child1_0,child1_1,child1_2,child1_3);
      
      /*! Find best rotation. We pick a first child (child1) and a sub-child 
	(child2child) of a different second child (child2), and swap child1 
	and child2child. We perform the best such swap. */
      float bestArea = 0;
      size_t bestChild1 = -1, bestChild2 = -1, bestChild2Child = -1;
      for (size_t c2=0; c2<4; c2++)
      {
	/*! ignore leaf nodes as we cannot descent into them */
	if (parent->child(c2).isBarrier()) continue;
	if (parent->child(c2).isLeaf()) continue;
	AABBNode* child2 = parent->child(c2).getAABBNode();
	
	/*! transpose child bounds */
	BBox<vfloat4> child2c0,child2c1,child2c2,child2c3;
	child2->bounds(child2c0,child2c1,child2c2,child2c3);
	
	/*! put child1_0 at each child2 position */
	float cost00 = halfArea3f(merge(child1_0,child2c1,child2c2,child2c3));
	float cost01 = halfArea3f(merge(child2c0,child1_0,child2c2,child2c3));
	float cost02 = halfArea3f(merge(child2c0,child2c1,child1_0,child2c3));
	float cost03 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_0));
	vfloat4 cost0 = vfloat4(cost00,cost01,cost02,cost03);
	vfloat4 min0 = vreduce_min(cost0);
	int pos0 = (int)bsf(movemask(min0 == cost0));
	
	/*! put child1_1 at each child2 position */
	float cost10 = halfArea3f(merge(child1_1,child2c1,child2c2,child2c3));
	float cost11 = halfArea3f(merge(child2c0,child1_1,child2c2,child2c3));
	float cost12 = halfArea3f(merge(child2c0,child2c1,child1_1,child2c3));
	float cost13 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_1));
	vfloat4 cost1 = vfloat4(cost10,cost11,cost12,cost13);
	vfloat4 min1 = vreduce_min(cost1);
	int pos1 = (int)bsf(movemask(min1 == cost1));
	
	/*! put child1_2 at each child2 position */
	float cost20 = halfArea3f(merge(child1_2,child2c1,child2c2,child2c3));
	float cost21 = halfArea3f(merge(child2c0,child1_2,child2c2,child2c3));
	float cost22 = halfArea3f(merge(child2c0,child2c1,child1_2,child2c3));
	float cost23 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_2));
	vfloat4 cost2 = vfloat4(cost20,cost21,cost22,cost23);
	vfloat4 min2 = vreduce_min(cost2);
	int pos2 = (int)bsf(movemask(min2 == cost2));
	
	/*! put child1_3 at each child2 position */
	float cost30 = halfArea3f(merge(child1_3,child2c1,child2c2,child2c3));
	float cost31 = halfArea3f(merge(child2c0,child1_3,child2c2,child2c3));
	float cost32 = halfArea3f(merge(child2c0,child2c1,child1_3,child2c3));
	float cost33 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_3));
	vfloat4 cost3 = vfloat4(cost30,cost31,cost32,cost33);
	vfloat4 min3 = vreduce_min(cost3);
	int pos3 = (int)bsf(movemask(min3 == cost3));
	
	/*! find best other child */
	vfloat4 area0123 = vfloat4(extract<0>(min0),extract<0>(min1),extract<0>(min2),extract<0>(min3)) - vfloat4(childArea[c2]);
	int pos[4] = { pos0,pos1,pos2,pos3 };
	const size_t mbd = BVH4::maxBuildDepth;
	vbool4 valid = vint4(int(depth+1))+cdepth <= vint4(mbd); // only select swaps that fulfill depth constraints
	valid &= vint4(int(c2)) != vint4(step);
	if (none(valid)) continue;
	size_t c1 = select_min(valid,area0123);
	float area = area0123[c1]; 
        if (c1 == c2) continue; // can happen if bounds are NANs
	
	/*! accept a swap when it reduces cost and is not swapping a node with itself */
	if (area < bestArea) {
	  bestArea = area;
	  bestChild1 = c1;
	  bestChild2 = c2;
	  bestChild2Child = pos[c1];
	}
      }
      
      /*! if we did not find a swap that improves the SAH then do nothing */
      if (bestChild1 == size_t(-1)) return 1+reduce_max(cdepth);
      
      /*! perform the best found tree rotation */
      AABBNode* child2 = parent->child(bestChild2).getAABBNode();
      AABBNode::swap(parent,bestChild1,child2,bestChild2Child);
      parent->setBounds(bestChild2,child2->bounds());
      AABBNode::compact(parent);
      AABBNode::compact(child2);
      
      /*! This returned depth is conservative as the child that was
       *  pulled up in the tree could have been on the critical path. */
      cdepth[bestChild1]++; // bestChild1 was pushed down one level
      return 1+reduce_max(cdepth); 
    }